

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SpectrumPtexTexture::Evaluate
          (SpectrumPtexTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  RGBColorSpace *cs;
  int iVar1;
  undefined1 auVar3 [56];
  undefined1 auVar2 [64];
  RGB RVar4;
  RGB local_70;
  float result [3];
  RGBIlluminantSpectrum local_50;
  RGB local_38;
  SampledSpectrum local_28;
  
  iVar1 = PtexTextureBase::SampleTexture(&this->super_PtexTextureBase,ctx,result);
  cs = RGBColorSpace::sRGB;
  if (iVar1 == 1) {
    SampledSpectrum::SampledSpectrum(&local_28,result[0]);
  }
  else {
    auVar3 = (undefined1  [56])0x0;
    local_70.b = result[2];
    if (this->spectrumType == Albedo) {
      RVar4 = Clamp<int,int>(&local_70,0,1);
      local_38.b = RVar4.b;
      auVar2._0_8_ = RVar4._0_8_;
      auVar2._8_56_ = auVar3;
      local_38._0_8_ = vmovlps_avx(auVar2._0_16_);
      RGBAlbedoSpectrum::RGBAlbedoSpectrum((RGBAlbedoSpectrum *)&local_50,cs,&local_38);
      local_28 = RGBAlbedoSpectrum::Sample((RGBAlbedoSpectrum *)&local_50,&lambda);
    }
    else if (this->spectrumType == Unbounded) {
      RGBUnboundedSpectrum::RGBUnboundedSpectrum
                ((RGBUnboundedSpectrum *)&local_50,RGBColorSpace::sRGB,&local_70);
      local_28 = RGBUnboundedSpectrum::Sample((RGBUnboundedSpectrum *)&local_50,&lambda);
    }
    else {
      RGBIlluminantSpectrum::RGBIlluminantSpectrum(&local_50,RGBColorSpace::sRGB,&local_70);
      local_28 = RGBIlluminantSpectrum::Sample(&local_50,&lambda);
    }
  }
  return (array<float,_4>)(array<float,_4>)local_28;
}

Assistant:

SampledSpectrum SpectrumPtexTexture::Evaluate(TextureEvalContext ctx,
                                              SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("Ptex not supported with GPU renderer");
    return SampledSpectrum(0);
#else
    float result[3];
    int nc = SampleTexture(ctx, result);
    if (nc == 1)
        return SampledSpectrum(result[0]);
    DCHECK_EQ(3, nc);
    RGB rgb(result[0], result[1], result[2]);
    if (spectrumType == SpectrumType::Unbounded)
        return RGBUnboundedSpectrum(*RGBColorSpace::sRGB, rgb).Sample(lambda);
    else if (spectrumType == SpectrumType::Albedo)
        return RGBAlbedoSpectrum(*RGBColorSpace::sRGB, Clamp(rgb, 0, 1)).Sample(lambda);
    else
        return RGBIlluminantSpectrum(*RGBColorSpace::sRGB, rgb).Sample(lambda);
#endif
}